

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  int iVar1;
  int local_84;
  wchar_t palette_index_1;
  int local_78;
  wchar_t local_74;
  wchar_t palette_index;
  wchar_t i;
  wchar_t ac;
  wchar_t vc;
  ui_entry_combiner_funcs_conflict combiner;
  wchar_t wStack_40;
  wchar_t color_offset;
  loc_conflict p;
  ui_entry_details *details_local;
  wchar_t n_local;
  wchar_t *auxvals_local;
  wchar_t *vals_local;
  wchar_t nlabel_local;
  wchar_t *label_local;
  
  _wStack_40 = details->value_position;
  combiner.vec_func._4_4_ = 0;
  if ((details->alternate_color_first & 1U) != 0) {
    combiner.vec_func._4_4_ = 5;
  }
  if (((L'\t' < info->ncolors) && (L'\x03' < info->nlabcolors)) && (L'\x04' < info->nsym)) {
    for (local_74 = L'\0'; local_74 < n; local_74 = local_74 + L'\x01') {
      local_78 = 2;
      if (vals[local_74] == L'\x7fffffff') {
        local_78 = 0;
      }
      else if (vals[local_74] == L'\x7ffffffe') {
        local_78 = 1;
      }
      else if (vals[local_74] != L'\0') {
        local_78 = 3;
      }
      if (((auxvals[local_74] != L'\0') && (auxvals[local_74] != L'\x7fffffff')) &&
         ((auxvals[local_74] != L'\x7ffffffe' && (vals[local_74] == L'\0')))) {
        local_78 = 4;
      }
      Term_putch(wStack_40,color_offset,info->colors[(int)(local_78 + combiner.vec_func._4_4_)],
                 info->symbols[local_78]);
      _wStack_40 = (loc_conflict)loc_sum((loc)_wStack_40,(loc)details->position_step);
      combiner.vec_func._4_4_ = combiner.vec_func._4_4_ ^ 5;
    }
    if ((L'\0' < nlabel) || ((details->show_combined & 1U) != 0)) {
      iVar1 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&ac);
      if (iVar1 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-entry-renderers.c"
                      ,0x2c6,
                      "void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                     );
      }
      (*combiner.finish_func)((ui_entry_combiner_state_conflict *)n);
      if (L'\0' < nlabel) {
        local_84 = 1;
        if ((details->known_rune & 1U) == 0) {
          local_84 = 0;
        }
        else if (((i == L'\0') || (i == L'\x7fffffff')) || (i == L'\x7ffffffe')) {
          if (((palette_index != L'\0') && (palette_index != L'\x7fffffff')) &&
             (palette_index != L'\x7ffffffe')) {
            local_84 = 3;
          }
        }
        else {
          local_84 = 2;
        }
        if ((details->vertical_label & 1U) == 0) {
          safe_queue_chars((details->label_position).x,(details->label_position).y,nlabel,
                           info->label_colors[local_84],label);
        }
        else {
          _wStack_40 = details->label_position;
          for (local_74 = L'\0'; local_74 < nlabel; local_74 = local_74 + L'\x01') {
            Term_putch(wStack_40,color_offset,info->label_colors[local_84],label[local_74]);
            color_offset = color_offset + L'\x01';
          }
        }
      }
      if ((details->show_combined & 1U) != 0) {
        show_combined_generic(info,details,i,palette_index);
      }
    }
    return;
  }
  __assert_fail("info->ncolors >= 10 && info->nlabcolors >= 4 && info->nsym >= 5",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-entry-renderers.c"
                ,0x2a8,
                "void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 5 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 10 && info->nlabcolors >= 4 && info->nsym >= 5);

	for (i = 0; i < n; ++i) {
		int palette_index = 2;

		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE) {
			palette_index = 0;
		} else if (vals[i] == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
		} else if (vals[i]) {
			palette_index = 3;
		}
		if (auxvals[i] && auxvals[i] != UI_ENTRY_UNKNOWN_VALUE &&
			auxvals[i] != UI_ENTRY_VALUE_NOT_PRESENT) {
			if (vals[i] == 0) {
				palette_index = 4;
			}
		}
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 5;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index = 1;

		if (! details->known_rune) {
			palette_index = 0;
		} else if (vc && vc != UI_ENTRY_UNKNOWN_VALUE &&
			vc != UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 2;
		} else if (ac && ac != UI_ENTRY_UNKNOWN_VALUE &&
			ac != UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 3;
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}